

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlcdnumber.cpp
# Opt level: O0

QString * int2string(int num,int base,int ndigits,bool *oflow)

{
  QLatin1StringView s_00;
  bool bVar1;
  QLatin1String *this;
  qsizetype qVar2;
  QChar *pQVar3;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  QString *in_RDI;
  long in_R8;
  long in_FS_OFFSET;
  int i;
  int len;
  uint n;
  char *p;
  bool negative;
  QString *s;
  char buf [42];
  QString *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  int iVar4;
  char *in_stack_fffffffffffffee8;
  QString *this_00;
  int local_f4;
  int local_f0;
  uint local_ec;
  char *local_e8;
  uint local_c4;
  QChar local_b6;
  QChar local_b4;
  QChar local_b2 [12];
  QChar local_9a;
  QString local_98;
  char local_80 [24];
  char local_68 [24];
  char local_50 [24];
  undefined1 local_38 [40];
  char local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QString::QString((QString *)0x5ba095);
  local_c4 = in_ESI;
  if ((int)in_ESI < 0) {
    local_c4 = -in_ESI;
  }
  this = (QLatin1String *)(ulong)in_EDX;
  switch(this) {
  case (QLatin1String *)0x0:
    QString::asprintf(local_50,"%*x",(ulong)in_ECX,(ulong)local_c4);
    QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       in_stack_fffffffffffffed8);
    QString::~QString((QString *)0x5ba11d);
    break;
  case (QLatin1String *)0x1:
    QString::asprintf(local_68,"%*i",(ulong)in_ECX,(ulong)local_c4);
    QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       in_stack_fffffffffffffed8);
    QString::~QString((QString *)0x5ba15f);
    break;
  case (QLatin1String *)0x2:
    QString::asprintf(local_80,"%*o",(ulong)in_ECX,(ulong)local_c4);
    QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                       in_stack_fffffffffffffed8);
    QString::~QString((QString *)0x5ba1a1);
    break;
  case (QLatin1String *)0x3:
    memset(local_38,0xaa,0x2a);
    local_ec = local_c4;
    local_f0 = 0;
    local_10[1] = 0;
    local_e8 = local_10 + 1;
    do {
      local_e8[-1] = ((byte)local_ec & 1) + 0x30;
      local_ec = local_ec >> 1;
      local_f0 = local_f0 + 1;
      local_e8 = local_e8 + -1;
    } while (local_ec != 0);
    if (0 < (int)(in_ECX - local_f0)) {
      in_stack_fffffffffffffee8 = (char *)(long)(int)(in_ECX - local_f0);
      QChar::QChar<char16_t,_true>(&local_9a,L' ');
      QString::QString(&local_98,(longlong)in_stack_fffffffffffffee8,
                       (QChar *)(ulong)(ushort)local_9a.ucs);
      QString::operator+=((QString *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                          in_stack_fffffffffffffed8);
      QString::~QString((QString *)0x5ba28a);
    }
    QLatin1String::QLatin1String(this,in_stack_fffffffffffffee8);
    s_00.m_data = (char *)this_00;
    s_00.m_size = (qsizetype)this;
    QString::operator+=(in_stack_fffffffffffffed8,s_00);
  }
  if ((int)in_ESI < 0) {
    local_f4 = 0;
    while (iVar4 = local_f4, qVar2 = QString::size(this_00), iVar4 < (int)qVar2) {
      in_stack_fffffffffffffed8 = (QString *)QString::operator[](in_stack_fffffffffffffed8,0x5ba2f3)
      ;
      QChar::QChar<char16_t,_true>(local_b2,L' ');
      bVar1 = operator!=((QChar *)CONCAT44(iVar4,in_stack_fffffffffffffee0),
                         (QChar *)in_stack_fffffffffffffed8);
      if (bVar1) {
        if (local_f4 == 0) {
          QChar::QChar<char16_t,_true>(&local_b6,L'-');
          QString::insert((longlong)this_00,(QChar *)0x0);
        }
        else {
          QChar::QChar<char16_t,_true>(&local_b4,L'-');
          pQVar3 = QString::operator[](in_stack_fffffffffffffed8,0x5ba344);
          pQVar3->ucs = local_b4.ucs;
        }
        break;
      }
      local_f4 = local_f4 + 1;
    }
  }
  if (in_R8 != 0) {
    qVar2 = QString::size(this_00);
    *(bool *)in_R8 = (int)in_ECX < (int)qVar2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QString int2string(int num, int base, int ndigits, bool *oflow)
{
    QString s;
    bool negative;
    if (num < 0) {
        negative = true;
        num      = -num;
    } else {
        negative = false;
    }
    switch(base) {
        case QLCDNumber::Hex:
            s = QString::asprintf("%*x", ndigits, num);
            break;
        case QLCDNumber::Dec:
            s = QString::asprintf("%*i", ndigits, num);
            break;
        case QLCDNumber::Oct:
            s = QString::asprintf("%*o", ndigits, num);
            break;
        case QLCDNumber::Bin:
            {
                char buf[42];
                char *p = &buf[41];
                uint n = num;
                int len = 0;
                *p = '\0';
                do {
                    *--p = (char)((n&1)+'0');
                    n >>= 1;
                    len++;
                } while (n != 0);
                len = ndigits - len;
                if (len > 0)
                    s += QString(len, u' ');
                s += QLatin1StringView(p);
            }
            break;
    }
    if (negative) {
        for (int i=0; i<(int)s.size(); i++) {
            if (s[i] != u' ') {
                if (i != 0) {
                    s[i-1] = u'-';
                } else {
                    s.insert(0, u'-');
                }
                break;
            }
        }
    }
    if (oflow)
        *oflow = (int)s.size() > ndigits;
    return s;
}